

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void testKeepAlives(StringRef *addrString)

{
  bool bVar1;
  int iVar2;
  C *pCVar3;
  socklen_t __len;
  undefined4 *__optval;
  sockaddr *__addr;
  Socket socket;
  dword_t delay;
  dword_t value;
  SockAddr addr;
  Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> local_70;
  undefined4 local_6c;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_68;
  undefined4 local_3c;
  sockaddr local_38;
  undefined4 uStack_28;
  undefined8 uStack_24;
  
  local_3c = 1;
  local_6c = 3;
  local_70.m_h = -1;
  printf("Opening a TCP socket (%d sec keep-alives)...\n",3);
  iVar2 = axl::io::psx::Socket::open((Socket *)&local_70,(char *)0x2,1,6);
  if ((char)iVar2 != '\0') {
    iVar2 = setsockopt(local_70.m_h,1,9,&local_3c,4);
    if (iVar2 == -1) {
      axl::err::setLastSystemError();
    }
    else {
      iVar2 = setsockopt(local_70.m_h,6,4,&local_6c,4);
      if (iVar2 == -1) {
        axl::err::setLastSystemError();
      }
      else {
        __optval = &local_6c;
        iVar2 = setsockopt(local_70.m_h,6,5,__optval,4);
        __len = (socklen_t)__optval;
        if (iVar2 != -1) {
          if (addrString->m_length == 0) {
            pCVar3 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
          }
          else {
            pCVar3 = axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::
                     ensureNullTerminated(addrString);
          }
          printf("Parsing address \'%s\'...\n",pCVar3);
          uStack_28 = 0;
          uStack_24 = 0;
          local_38.sa_family = 0;
          local_38.sa_data[0] = '\0';
          local_38.sa_data[1] = '\0';
          local_38.sa_data[2] = '\0';
          local_38.sa_data[3] = '\0';
          local_38.sa_data[4] = '\0';
          local_38.sa_data[5] = '\0';
          local_38.sa_data[6] = '\0';
          local_38.sa_data[7] = '\0';
          local_38.sa_data[8] = '\0';
          local_38.sa_data[9] = '\0';
          local_38.sa_data[10] = '\0';
          local_38.sa_data[0xb] = '\0';
          local_38.sa_data[0xc] = '\0';
          local_38.sa_data[0xd] = '\0';
          bVar1 = axl::io::parseSockAddr(&local_38,0x1c,addrString);
          if (bVar1) {
            local_68.m_length._0_1_ = 0;
            local_68.m_length._1_7_ = 0;
            local_68.m_isNullTerminated = false;
            local_68.m_p = (C *)0x0;
            local_68.m_hdr._0_1_ = 0;
            local_68.m_hdr._1_7_ = 0;
            axl::io::getSockAddrString((String *)&local_68,&local_38);
            pCVar3 = local_68.m_p;
            if (CONCAT71(local_68.m_length._1_7_,(undefined1)local_68.m_length) == 0) {
              pCVar3 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
            }
            printf("Connecting to %s...\n",pCVar3);
            axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_68);
            iVar2 = axl::io::psx::Socket::connect((Socket *)&local_70,(int)&local_38,__addr,__len);
            if ((char)iVar2 != '\0') {
              puts("Press CTRL+C to exit...");
              do {
                axl::sys::sleep(1000);
              } while( true );
            }
            axl::err::getLastErrorDescription();
            pCVar3 = local_68.m_p;
            if (CONCAT71(local_68.m_length._1_7_,(undefined1)local_68.m_length) == 0) {
              pCVar3 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
            }
            printf("socket.connect failed (%s)\n",pCVar3);
            axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_68);
          }
          else {
            axl::err::getLastErrorDescription();
            pCVar3 = local_68.m_p;
            if (CONCAT71(local_68.m_length._1_7_,(undefined1)local_68.m_length) == 0) {
              pCVar3 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
            }
            printf("addr.parse failed (%s)\n",pCVar3);
            axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_68);
          }
          goto LAB_0010d035;
        }
        axl::err::setLastSystemError();
      }
    }
  }
  axl::err::getLastErrorDescription();
  pCVar3 = local_68.m_p;
  if (CONCAT71(local_68.m_length._1_7_,(undefined1)local_68.m_length) == 0) {
    pCVar3 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  }
  printf("socket.open failed (%s)\n",pCVar3);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_68);
LAB_0010d035:
  axl::sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle(&local_70);
  return;
}

Assistant:

void
testKeepAlives(const sl::StringRef& addrString) {
	dword_t value = 1;
	dword_t delay = 3;

	io::Socket socket;

	printf("Opening a TCP socket (%d sec keep-alives)...\n", delay);

	bool result =
		socket.open(AF_INET, SOCK_STREAM, IPPROTO_TCP) &&
		socket.setOption(SOL_SOCKET, SO_KEEPALIVE, &value, sizeof(value)) &&
		socket.setOption(IPPROTO_TCP, TCP_KEEPIDLE, &delay, sizeof(delay)) &&
		socket.setOption(IPPROTO_TCP, TCP_KEEPINTVL, &delay, sizeof(delay));

	if (!result) {
		printf("socket.open failed (%s)\n", err::getLastErrorDescription().sz());
		return;
	}

	printf("Parsing address '%s'...\n", addrString.sz());

	io::SockAddr addr;
	result = addr.parse(addrString);
	if (!result) {
		printf("addr.parse failed (%s)\n", err::getLastErrorDescription().sz());
		return;
	}

	printf("Connecting to %s...\n", addr.getString().sz());

	result = socket.connect(addr);
	if (!result) {
		printf("socket.connect failed (%s)\n", err::getLastErrorDescription().sz());
		return;
	}

	printf("Press CTRL+C to exit...\n");

	for (;;) {
		sys::sleep(1000);
	}
}